

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QRhiSwapChainHdrInfo *info)

{
  int *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined4 in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar1;
  undefined1 *local_10;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_RSI,t);
  if (*in_RDX == 0) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<(in_RSI,t);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
    QDebug::operator<<(in_RSI,t);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
  }
  else if (*in_RDX == 1) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<(in_RSI,t);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
    QDebug::nospace(in_RSI);
    QDebug::operator<<(in_RSI,t);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
  }
  iVar1 = in_RDX[3];
  if (iVar1 == 0) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<(in_RSI,t);
    QDebug::operator<<((QDebug *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac
                      );
  }
  else if (iVar1 == 1) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<(in_RSI,t);
  }
  QDebug::nospace(in_RSI);
  QDebug::operator<<((QDebug *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                     (char)((uint)in_stack_ffffffffffffffac >> 0x18));
  QDebug::QDebug((QDebug *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                 (QDebug *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(char **)(in_FS_OFFSET + 0x28) != t) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiSwapChainHdrInfo &info)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiSwapChainHdrInfo(";
    switch (info.limitsType) {
    case QRhiSwapChainHdrInfo::LuminanceInNits:
        dbg.nospace() << " minLuminance=" << info.limits.luminanceInNits.minLuminance
                      << " maxLuminance=" << info.limits.luminanceInNits.maxLuminance;
        break;
    case QRhiSwapChainHdrInfo::ColorComponentValue:
        dbg.nospace() << " maxColorComponentValue=" << info.limits.colorComponentValue.maxColorComponentValue;
        dbg.nospace() << " maxPotentialColorComponentValue=" << info.limits.colorComponentValue.maxPotentialColorComponentValue;
        break;
    }
    switch (info.luminanceBehavior) {
    case QRhiSwapChainHdrInfo::SceneReferred:
        dbg.nospace() << " scene-referred, SDR white level=" << info.sdrWhiteLevel;
        break;
    case QRhiSwapChainHdrInfo::DisplayReferred:
        dbg.nospace() << " display-referred";
        break;
    }
    dbg.nospace() << ')';
    return dbg;
}